

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.cpp
# Opt level: O0

int ply_write(p_ply ply,double value)

{
  bool bVar1;
  int iVar2;
  p_ply_element ptVar3;
  p_ply_property_conflict ptVar4;
  p_ply in_RDI;
  bool bVar5;
  double in_XMM0_Qa;
  int spaceafter;
  int breakafter;
  int type;
  p_ply_property_conflict property;
  p_ply_element element;
  bool local_37;
  bool local_36;
  e_ply_type local_2c;
  
  if (in_RDI->nelements < in_RDI->welement) {
    return 0;
  }
  ptVar3 = in_RDI->element + in_RDI->welement;
  if (ptVar3->nproperties < in_RDI->wproperty) {
    return 0;
  }
  ptVar4 = ptVar3->property + in_RDI->wproperty;
  if (ptVar4->type == PLY_LIST) {
    if (in_RDI->wvalue_index == 0) {
      local_2c = ptVar4->length_type;
      in_RDI->wlength = (long)in_XMM0_Qa;
    }
    else {
      local_2c = ptVar4->value_type;
    }
  }
  else {
    local_2c = ptVar4->type;
    in_RDI->wlength = 0;
  }
  iVar2 = (*in_RDI->odriver->ohandler[(int)local_2c])(in_RDI,in_XMM0_Qa);
  if (iVar2 == 0) {
    ply_ferror(in_RDI,"Failed writing %s of %s %d (%s: %s)",ptVar4,ptVar3,in_RDI->winstance_index,
               in_RDI->odriver->name,ply_type_list[(int)local_2c]);
    return 0;
  }
  in_RDI->wvalue_index = in_RDI->wvalue_index + 1;
  if (in_RDI->wlength < in_RDI->wvalue_index) {
    in_RDI->wvalue_index = 0;
    in_RDI->wproperty = in_RDI->wproperty + 1;
  }
  bVar1 = ptVar3->nproperties <= in_RDI->wproperty;
  if (bVar1) {
    in_RDI->wproperty = 0;
    in_RDI->winstance_index = in_RDI->winstance_index + 1;
  }
  if (ptVar3->ninstances <= in_RDI->winstance_index) {
    in_RDI->winstance_index = 0;
    do {
      in_RDI->welement = in_RDI->welement + 1;
      bVar5 = false;
      if (in_RDI->welement < in_RDI->nelements) {
        bVar5 = in_RDI->element[in_RDI->welement].ninstances == 0;
      }
    } while (bVar5);
  }
  if (in_RDI->storage_mode != PLY_ASCII) {
    return 1;
  }
  if (!bVar1) {
    iVar2 = putc(0x20,(FILE *)in_RDI->fp);
    local_36 = false;
    if (iVar2 < 1) goto LAB_0099d07e;
  }
  local_37 = true;
  if (bVar1) {
    iVar2 = putc(10,(FILE *)in_RDI->fp);
    local_37 = 0 < iVar2;
  }
  local_36 = local_37;
LAB_0099d07e:
  return (uint)local_36;
}

Assistant:

int ply_write(p_ply ply, double value) {
    p_ply_element element = NULL;
    p_ply_property property = NULL;
    int type = -1;
    int breakafter = 0;
    int spaceafter = 1;
    if (ply->welement > ply->nelements) return 0;
    element = &ply->element[ply->welement];
    if (ply->wproperty > element->nproperties) return 0;
    property = &element->property[ply->wproperty];
    if (property->type == PLY_LIST) {
        if (ply->wvalue_index == 0) {
            type = property->length_type;
            ply->wlength = (long)value;
        } else
            type = property->value_type;
    } else {
        type = property->type;
        ply->wlength = 0;
    }
    if (!ply->odriver->ohandler[type](ply, value)) {
        ply_ferror(ply, "Failed writing %s of %s %d (%s: %s)", property->name,
                   element->name, ply->winstance_index, ply->odriver->name,
                   ply_type_list[type]);
        return 0;
    }
    ply->wvalue_index++;
    if (ply->wvalue_index > ply->wlength) {
        ply->wvalue_index = 0;
        ply->wproperty++;
    }
    if (ply->wproperty >= element->nproperties) {
        ply->wproperty = 0;
        ply->winstance_index++;
        breakafter = 1;
        spaceafter = 0;
    }
    if (ply->winstance_index >= element->ninstances) {
        ply->winstance_index = 0;
        do {
            ply->welement++;
            element = &ply->element[ply->welement];
        } while (ply->welement < ply->nelements && !element->ninstances);
    }
    if (ply->storage_mode == PLY_ASCII) {
        return (!spaceafter || putc(' ', ply->fp) > 0) &&
               (!breakafter || putc('\n', ply->fp) > 0);
    } else {
        return 1;
    }
}